

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::xr_motion_marks*,std::allocator<xray_re::xr_motion_marks*>>,xray_re::xr_writer::f_w_const<xray_re::xr_motion_marks>>
          (xr_writer *this,
          vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_> *container
          ,f_w_const<xray_re::xr_motion_marks> write)

{
  bool bVar1;
  reference ppxVar2;
  __normal_iterator<xray_re::xr_motion_marks_*const_*,_std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_> *container_local;
  xr_writer *this_local;
  f_w_const<xray_re::xr_motion_marks> write_local;
  
  end = std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::begin
                  (container);
  local_38._M_current =
       (xr_motion_marks **)
       std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::end
                 (container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) break;
    ppxVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_motion_marks_*const_*,_std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>_>
              ::operator*(&end);
    f_w_const<xray_re::xr_motion_marks>::operator()
              ((f_w_const<xray_re::xr_motion_marks> *)&this_local,*ppxVar2,this);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_motion_marks_*const_*,_std::vector<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}